

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

void GetFileAndPassword(char *nextarg,char **file,char **password)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *__s;
  char *pcVar6;
  char *pcVar7;
  
  sVar3 = strlen(nextarg);
  if (sVar3 == 0) {
LAB_00112e2c:
    pcVar4 = (char *)0x0;
  }
  else {
    iVar2 = curl_strnequal(nextarg,"pkcs11:",7);
    if ((iVar2 == 0) && (pcVar4 = strpbrk(nextarg,":\\"), pcVar4 != (char *)0x0)) {
      pcVar4 = (char *)malloc(sVar3 + 1);
      if (pcVar4 != (char *)0x0) {
        pcVar7 = pcVar4;
        if (*nextarg == '\0') {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = (char *)0x0;
          __s = nextarg;
          do {
            sVar3 = strcspn(__s,":\\");
            strncpy(pcVar7,__s,sVar3);
            pcVar6 = __s + sVar3;
            pcVar7 = pcVar7 + sVar3;
            if (__s[sVar3] == '\\') {
              cVar1 = pcVar6[1];
              if (cVar1 == '\\') {
                *pcVar7 = '\\';
              }
              else {
                if (cVar1 != ':') {
                  if (cVar1 == '\0') {
                    pcVar6 = pcVar6 + 1;
                    *pcVar7 = '\\';
                    pcVar7 = pcVar7 + 1;
                  }
                  else {
                    *pcVar7 = '\\';
                    pcVar7[1] = cVar1;
                    pcVar7 = pcVar7 + 2;
                    pcVar6 = pcVar6 + 2;
                  }
                  goto LAB_00112e11;
                }
                *pcVar7 = ':';
              }
              pcVar6 = pcVar6 + 2;
              pcVar7 = pcVar7 + 1;
            }
            else if (__s[sVar3] == ':') {
              if (pcVar6[1] == '\0') {
                pcVar5 = (char *)0x0;
              }
              else {
                pcVar5 = strdup(pcVar6 + 1);
              }
              break;
            }
LAB_00112e11:
            __s = pcVar6;
          } while (*pcVar6 != '\0');
        }
        *pcVar7 = '\0';
        goto LAB_00112e32;
      }
      goto LAB_00112e2c;
    }
    pcVar4 = strdup(nextarg);
  }
  pcVar5 = (char *)0x0;
LAB_00112e32:
  free(*file);
  *file = pcVar4;
  if (pcVar5 != (char *)0x0) {
    free(*password);
    *password = pcVar5;
  }
  cleanarg(nextarg);
  return;
}

Assistant:

static void
GetFileAndPassword(char *nextarg, char **file, char **password)
{
  char *certname, *passphrase;
  parse_cert_parameter(nextarg, &certname, &passphrase);
  Curl_safefree(*file);
  *file = certname;
  if(passphrase) {
    Curl_safefree(*password);
    *password = passphrase;
  }
  cleanarg(nextarg);
}